

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo(GreaterThanOrEqualTo<int> *this,int rhs)

{
  ostream *this_00;
  stringstream iss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_._M_dataplus.
  _M_p = (pointer)&(this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).
                   description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_.field_2.
  _M_local_buf[0] = '\0';
  this->rhs_ = rhs;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"greater than or equal to");
  std::ostream::operator<<((ostream *)this_00,rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

GreaterThanOrEqualTo(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "greater than or equal to" << rhs;
      this->description_ = iss.str();
    }